

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool check_for_option(int argc,char **argv,char *pOption)

{
  int iVar1;
  long lVar2;
  
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    if ((byte)(*argv[lVar2] | 2U) == 0x2f) {
      iVar1 = crnlib::crn_stricmp(argv[lVar2] + 1,pOption);
      if (iVar1 == 0) break;
    }
  }
  return lVar2 < argc;
}

Assistant:

static bool check_for_option(int argc, char* argv[], const char* pOption)
{
    for (int i = 1; i < argc; i++)
    {
        if ((argv[i][0] == '/') || (argv[i][0] == '-'))
        {
            if (crn_stricmp(&argv[i][1], pOption) == 0)
                return true;
        }
    }
    return false;
}